

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::copyAppend
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,Command *e)

{
  qsizetype *pqVar1;
  Command *pCVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  if ((b != e) && (b < e)) {
    pCVar2 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      pDVar4 = (b->cmd).name.d.d;
      pCVar2[lVar3].cmd.name.d.d = pDVar4;
      pCVar2[lVar3].cmd.name.d.ptr = (b->cmd).name.d.ptr;
      pCVar2[lVar3].cmd.name.d.size = (b->cmd).name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar4 = (b->cmd).type.d.d;
      pCVar2[lVar3].cmd.type.d.d = pDVar4;
      pCVar2[lVar3].cmd.type.d.ptr = (b->cmd).type.d.ptr;
      pCVar2[lVar3].cmd.type.d.size = (b->cmd).type.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->cmd).typeSuffix.d.d;
      pCVar2[lVar3].cmd.typeSuffix.d.d = pDVar4;
      pCVar2[lVar3].cmd.typeSuffix.d.ptr = (b->cmd).typeSuffix.d.ptr;
      pCVar2[lVar3].cmd.typeSuffix.d.size = (b->cmd).typeSuffix.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->args).d.d;
      pCVar2[lVar3].args.d.d = pDVar5;
      pCVar2[lVar3].args.d.ptr = (b->args).d.ptr;
      pCVar2[lVar3].args.d.size = (b->args).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pCVar2[lVar3].deviceLevel = b->deviceLevel;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }